

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ParseTypeUrl
          (Status *__return_storage_ptr__,DescriptorPoolTypeResolver *this,string *type_url,
          string *type_name)

{
  pointer pcVar1;
  StringPiece error_message;
  char *pcVar2;
  int iVar3;
  Status *extraout_RAX;
  Status *extraout_RAX_00;
  Status *pSVar4;
  AlphaNum *in_R9;
  bool bVar5;
  AlphaNum local_120;
  AlphaNum local_f0;
  undefined1 local_c0 [32];
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  AlphaNum local_70;
  string *local_40;
  Status *local_38;
  
  local_40 = type_name;
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)type_url);
  pcVar1 = (this->url_prefix_)._M_dataplus._M_p;
  local_70.piece_data_ = local_70.digits;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->url_prefix_)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  pcVar2 = local_70.piece_data_;
  local_38 = __return_storage_ptr__;
  if (local_98[0]._M_allocated_capacity == local_70.piece_size_) {
    if (local_98[0]._M_allocated_capacity == 0) {
      bVar5 = false;
    }
    else {
      iVar3 = bcmp(local_a0,local_70.piece_data_,local_98[0]._M_allocated_capacity);
      bVar5 = iVar3 != 0;
    }
  }
  else {
    bVar5 = true;
  }
  if (pcVar2 != local_70.digits) {
    operator_delete(pcVar2);
  }
  if (local_a0 != local_98[0]._M_local_buf + 8) {
    operator_delete(local_a0);
  }
  if (bVar5) {
    local_a0 = "Invalid type URL, type URLs must be of the form \'";
    local_98[0]._M_allocated_capacity = 0x31;
    local_70.piece_data_ = (this->url_prefix_)._M_dataplus._M_p;
    local_70.piece_size_ = (this->url_prefix_)._M_string_length;
    local_120.piece_data_ = "/<typename>\', got: ";
    local_120.piece_size_ = 0x13;
    local_f0.piece_data_ = (type_url->_M_dataplus)._M_p;
    local_f0.piece_size_ = type_url->_M_string_length;
    StrCat_abi_cxx11_((string *)local_c0,(protobuf *)&local_a0,&local_70,&local_120,&local_f0,in_R9)
    ;
    error_message.length_ = local_c0._8_8_;
    error_message.ptr_ = (char *)local_c0._0_8_;
    if ((long)local_c0._8_8_ < 0) {
      StringPiece::LogFatalSizeTooBig(local_c0._8_8_,"size_t to int conversion");
    }
    Status::Status(local_38,INVALID_ARGUMENT,error_message);
    pSVar4 = (Status *)(local_c0 + 0x10);
    if ((Status *)local_c0._0_8_ != pSVar4) {
      operator_delete((void *)local_c0._0_8_);
      pSVar4 = extraout_RAX;
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)type_url);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_a0);
    if (local_a0 != local_98[0]._M_local_buf + 8) {
      operator_delete(local_a0);
    }
    Status::Status(local_38);
    pSVar4 = extraout_RAX_00;
  }
  return pSVar4;
}

Assistant:

Status ParseTypeUrl(const string& type_url, std::string* type_name) {
    if (type_url.substr(0, url_prefix_.size() + 1) != url_prefix_ + "/") {
      return Status(
          util::error::INVALID_ARGUMENT,
          StrCat("Invalid type URL, type URLs must be of the form '",
                       url_prefix_, "/<typename>', got: ", type_url));
    }
    *type_name = type_url.substr(url_prefix_.size() + 1);
    return Status();
  }